

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O2

shared_ptr<helics::Broker> helics::BrokerFactory::findBroker(string_view brokerName)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ulonglong index;
  char *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  BrokerFactory *this;
  shared_ptr<helics::Broker> sVar2;
  allocator<char> local_51;
  shared_ptr<helics::Broker> brk;
  string_view brokerName_local;
  char *ept;
  
  brokerName_local._M_len = (size_t)brokerName._M_str;
  this = (BrokerFactory *)brokerName._M_len;
  brokerName_local._M_str = in_RDX;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&ept,&brokerName_local,&local_51);
  gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::findObject
            ((SearchableObjectHolder<helics::Broker,_helics::CoreType> *)&brk,
             (string *)searchableBrokers);
  std::__cxx11::string::~string((string *)&ept);
  _Var1 = brk.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if (brk.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    if (brokerName_local._M_len == 0) {
      getConnectedBroker();
    }
    else {
      if (*brokerName_local._M_str == '#') {
        ept = (char *)0x0;
        index = strtoull(brokerName_local._M_str + 1,&ept,10);
        if (brokerName_local._M_str + 1 < ept) {
          getBrokerByIndex(this,index);
          goto LAB_0027c5f1;
        }
      }
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
    }
  }
  else {
    *(element_type **)this =
         brk.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    brk.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var1._M_pi;
    brk.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
LAB_0027c5f1:
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&brk.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<helics::Broker>)
         sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Broker> findBroker(std::string_view brokerName)
{
    auto brk = searchableBrokers.findObject(std::string(brokerName));
    if (brk) {
        return brk;
    }
    if (brokerName.empty()) {
        return getConnectedBroker();
    }
    if (brokerName.front() == '#') {
        char* ept = nullptr;
        auto val = std::strtoull(brokerName.data() + 1, &ept, 10);
        return (ept > brokerName.data() + 1) ? getBrokerByIndex(val) : nullptr;
    }
    return nullptr;
}